

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

char * __thiscall cmMakefile::GetSONameFlag(cmMakefile *this,string *language)

{
  char *pcVar1;
  string name;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CMAKE_SHARED_LIBRARY_SONAME",&local_31);
  if (language->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_30);
    std::__cxx11::string::append((string *)&local_30);
  }
  std::__cxx11::string::append((char *)&local_30);
  pcVar1 = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

const char* cmMakefile::GetSONameFlag(const std::string& language) const
{
  std::string name = "CMAKE_SHARED_LIBRARY_SONAME";
  if (!language.empty()) {
    name += "_";
    name += language;
  }
  name += "_FLAG";
  return GetDefinition(name);
}